

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall sglr::ReferenceContext::bindVertexArray(ReferenceContext *this,deUint32 array)

{
  int *piVar1;
  ObjectManager<sglr::rc::VertexArray> *this_00;
  VertexArray *this_01;
  pair<unsigned_int,_sglr::rc::VertexArray_*> local_30;
  
  if (array == 0) {
    this_01 = (VertexArray *)0x0;
  }
  else {
    this_00 = &this->m_vertexArrays;
    this_01 = rc::ObjectManager<sglr::rc::VertexArray>::find(this_00,array);
    if (this_01 == (VertexArray *)0x0) {
      this_01 = (VertexArray *)operator_new(0x30);
      rc::VertexArray::VertexArray(this_01,array,(this->m_limits).maxVertexAttribs);
      local_30.first = (this_01->super_NamedObject).m_name;
      if (this_00->m_lastName < local_30.first) {
        this_00->m_lastName = local_30.first;
      }
      local_30.second = this_01;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::VertexArray*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>>
      ::_M_emplace_unique<std::pair<unsigned_int,sglr::rc::VertexArray*>>
                ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,sglr::rc::VertexArray*>,std::_Select1st<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,sglr::rc::VertexArray*>>>
                  *)&(this->m_vertexArrays).m_objects,&local_30);
    }
  }
  if (this_01 != (VertexArray *)0x0) {
    piVar1 = &(this_01->super_NamedObject).m_refCount;
    *piVar1 = *piVar1 + 1;
  }
  if (this->m_vertexArrayBinding != (VertexArray *)0x0) {
    rc::ObjectManager<sglr::rc::VertexArray>::releaseReference
              (&this->m_vertexArrays,this->m_vertexArrayBinding);
  }
  this->m_vertexArrayBinding = this_01;
  return;
}

Assistant:

void ReferenceContext::bindVertexArray (deUint32 array)
{
	rc::VertexArray* vertexArrayObject = DE_NULL;

	if (array != 0)
	{
		vertexArrayObject = m_vertexArrays.find(array);
		if (!vertexArrayObject)
		{
			vertexArrayObject = new rc::VertexArray(array, m_limits.maxVertexAttribs);
			m_vertexArrays.insert(vertexArrayObject);
		}
	}

	// Create new references
	if (vertexArrayObject)
		m_vertexArrays.acquireReference(vertexArrayObject);

	// Remove old references
	if (m_vertexArrayBinding)
		m_vertexArrays.releaseReference(m_vertexArrayBinding);

	m_vertexArrayBinding = vertexArrayObject;
}